

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O0

RefEl __thiscall lf::base::RefEl::SubType(RefEl *this,dim_t sub_codim,dim_t sub_index)

{
  dim_t dVar1;
  size_type sVar2;
  runtime_error *prVar3;
  dim_t sub_index_local;
  dim_t sub_codim_local;
  RefEl *this_local;
  
  dVar1 = Dimension(this);
  if (dVar1 < sub_codim) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"sub_codim > Dimension()");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar2 = NumSubEntities(this,sub_codim);
  if (sub_index < sVar2) {
    if (sub_codim == 0) {
      this_local._7_1_ = (RefEl)this->type_;
    }
    else {
      dVar1 = Dimension(this);
      if (sub_codim == dVar1) {
        this_local._7_1_ = kPoint();
      }
      else {
        dVar1 = Dimension(this);
        if (dVar1 - sub_codim != 1) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"This code should never be reached.");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        this_local._7_1_ = kSegment();
      }
    }
    return (RefEl)this_local._7_1_;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"sub_index >= NumSubEntities");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[nodiscard]] constexpr RefEl SubType(dim_t sub_codim,
                                        dim_t sub_index) const {
    LF_ASSERT_MSG_CONSTEXPR(sub_codim >= 0, "sub_codim is negative");
    LF_ASSERT_MSG_CONSTEXPR(sub_codim <= Dimension(),
                            "sub_codim > Dimension()");
    LF_ASSERT_MSG_CONSTEXPR(sub_index >= 0, "sub_index is negative");
    LF_ASSERT_MSG_CONSTEXPR(sub_index < NumSubEntities(sub_codim),
                            "sub_index >= NumSubEntities");

    if (sub_codim == 0) {
      return *this;
    }
    if (sub_codim == Dimension()) {
      return kPoint();
    }
    if (Dimension() - sub_codim == 1) {
      return kSegment();
    } else {  // NOLINT(readability-else-after-return)
      LF_ASSERT_MSG_CONSTEXPR(false, "This code should never be reached.");
    }

    return kPoint();  // prevent warnings from compiler
  }